

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_XPM_Image.cxx
# Opt level: O0

int hexdigit(int x)

{
  int iVar1;
  undefined4 local_c;
  int x_local;
  
  iVar1 = isdigit(x);
  if (iVar1 == 0) {
    iVar1 = isupper(x);
    if (iVar1 == 0) {
      iVar1 = islower(x);
      if (iVar1 == 0) {
        local_c = 0x14;
      }
      else {
        local_c = x + -0x57;
      }
    }
    else {
      local_c = x + -0x37;
    }
  }
  else {
    local_c = x + -0x30;
  }
  return local_c;
}

Assistant:

static int hexdigit(int x) {	// I - Hex digit...
  if (isdigit(x)) return x-'0';
  if (isupper(x)) return x-'A'+10;
  if (islower(x)) return x-'a'+10;
  return 20;
}